

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O3

ostream * __thiscall foxxll::request::print(request *this,ostream *out)

{
  ostream *poVar1;
  char *pcVar2;
  bool bVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"File object address: ",0x15);
  poVar1 = std::ostream::_M_insert<void_const*>(out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," Buffer address: ",0x11);
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," File offset: ",0xe);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," Transfer size: ",0x10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," bytes Type of transfer: ",0x19);
  bVar3 = this->op_ == READ;
  pcVar2 = "WRITE";
  if (bVar3) {
    pcVar2 = "READ";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,(ulong)bVar3 ^ 5);
  return out;
}

Assistant:

std::ostream& request::print(std::ostream& out) const
{
    out << "File object address: " << file_
        << " Buffer address: " << static_cast<void*>(buffer_)
        << " File offset: " << offset_
        << " Transfer size: " << bytes_ << " bytes"
        " Type of transfer: " << ((op_ == READ) ? "READ" : "WRITE");
    return out;
}